

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

TracedArray * __thiscall perfetto::TracedValue::WriteArray(TracedValue *this)

{
  EventContext *pEVar1;
  TracedArray *in_RDI;
  
  pEVar1 = this->event_context_;
  in_RDI->annotation_ = this->annotation_;
  in_RDI->event_context_ = pEVar1;
  return in_RDI;
}

Assistant:

TracedArray TracedValue::WriteArray() && {
  // Note: this passes |checked_scope_.is_active_| bit to the parent to be
  // picked up later by the new TracedDictionary.
  PERFETTO_DCHECK(checked_scope_.is_active());
  checked_scope_.Reset();

  PERFETTO_DCHECK(!annotation_->is_finalized());
  return TracedArray(annotation_, event_context_,
                     checked_scope_.parent_scope());
}